

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_26UL> *params_2)

{
  size_t sVar1;
  long lVar2;
  size_t size;
  char *__dest;
  long local_48 [2];
  char *local_38;
  
  local_48[0] = *(long *)(this + 8);
  local_48[1] = params->size_;
  local_38 = params_1->ptr;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_48 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  heapString(__return_storage_ptr__,size);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(__dest,*(void **)this,sVar1);
    __dest = __dest + sVar1;
  }
  sVar1 = params->size_;
  if (sVar1 != 0) {
    memcpy(__dest,params->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  if (params_1->ptr != (char *)0x0) {
    memcpy(__dest,&params_1->size_,(size_t)params_1->ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}